

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

int yy_term(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *cclass;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *cclass_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *cclass_01;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *cclass_02;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *cclass_03;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *cclass_04;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *cclass_05;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *cclass_06;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *cclass_07;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *cclass_08;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *cclass_09;
  char *extraout_RDX_19;
  char *extraout_RDX_20;
  char *cclass_10;
  char *extraout_RDX_21;
  char *extraout_RDX_22;
  char *cclass_11;
  char *extraout_RDX_23;
  char *extraout_RDX_24;
  char *cclass_12;
  char *extraout_RDX_25;
  char *extraout_RDX_26;
  char *cclass_13;
  char *extraout_RDX_27;
  char *extraout_RDX_28;
  char *cclass_14;
  char *cclass_15;
  char *extraout_RDX_29;
  char *extraout_RDX_30;
  char *cclass_16;
  char *extraout_RDX_31;
  char *extraout_RDX_32;
  char *cclass_17;
  char *extraout_RDX_33;
  char *extraout_RDX_34;
  char *cclass_18;
  char *extraout_RDX_35;
  char *extraout_RDX_36;
  char *cclass_19;
  char *cclass_20;
  char *cclass_21;
  char *extraout_RDX_37;
  char *extraout_RDX_38;
  char *cclass_22;
  char *extraout_RDX_39;
  char *extraout_RDX_40;
  char *cclass_23;
  char *extraout_RDX_41;
  char *extraout_RDX_42;
  char *cclass_24;
  char *extraout_RDX_43;
  char *extraout_RDX_44;
  char *cclass_25;
  char *cclass_26;
  char *cclass_27;
  char *extraout_RDX_45;
  char *extraout_RDX_46;
  char *cclass_28;
  char *cclass_29;
  char *cclass_30;
  char *cclass_31;
  int yypos25;
  code *pcVar9;
  char *pcVar10;
  int yythunkpos367;
  int yythunkpos25;
  int yypos367;
  int iVar11;
  
  iVar8 = G->pos;
  iVar7 = G->thunkpos;
  yyDo(G,yyPush,3,0,"yyPush");
  iVar5 = G->pos;
  iVar1 = G->thunkpos;
  yyText(G,G->begin,G->end);
  iVar4 = G->pos;
  iVar11 = G->thunkpos;
  G->begin = iVar4;
  iVar3 = yymatchClass(G,(uchar *)"",cclass);
  pcVar10 = extraout_RDX;
  if (iVar3 != 0) {
    do {
      iVar4 = G->pos;
      iVar11 = G->thunkpos;
      iVar3 = yymatchClass(G,(uchar *)"",pcVar10);
      pcVar10 = extraout_RDX_00;
    } while (iVar3 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar11;
    iVar3 = yymatchChar(G,0x2e);
    if (iVar3 != 0) {
      iVar3 = yymatchClass(G,(uchar *)"",cclass_00);
      pcVar10 = extraout_RDX_01;
      while (iVar3 != 0) {
        iVar4 = G->pos;
        iVar11 = G->thunkpos;
        iVar3 = yymatchClass(G,(uchar *)"",pcVar10);
        pcVar10 = extraout_RDX_02;
      }
    }
LAB_001077ac:
    G->pos = iVar4;
    G->thunkpos = iVar11;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    iVar4 = yymatchChar(G,0x69);
    if (iVar4 == 0) goto LAB_001077f2;
    iVar8 = G->begin;
    iVar7 = G->end;
    pcVar9 = yy_1_complex;
    pcVar10 = "yy_1_complex";
    goto LAB_00107c79;
  }
  G->pos = iVar4;
  G->thunkpos = iVar11;
  iVar4 = yymatchChar(G,0x2e);
  if ((iVar4 != 0) &&
     (iVar4 = yymatchClass(G,(uchar *)"",cclass_01), pcVar10 = extraout_RDX_03, iVar4 != 0)) {
    do {
      iVar4 = G->pos;
      iVar11 = G->thunkpos;
      iVar3 = yymatchClass(G,(uchar *)"",pcVar10);
      pcVar10 = extraout_RDX_04;
    } while (iVar3 != 0);
    goto LAB_001077ac;
  }
LAB_001077f2:
  G->pos = iVar5;
  G->thunkpos = iVar1;
  yyDo(G,yyPush,1,0,"yyPush");
  iVar4 = G->pos;
  iVar11 = G->thunkpos;
  iVar3 = yymatchString(G,"0b");
  if (iVar3 == 0) {
LAB_001078a9:
    G->pos = iVar4;
    G->thunkpos = iVar11;
    iVar3 = yymatchString(G,"0d");
    if (iVar3 != 0) {
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar3 = yymatchClass(G,(uchar *)"",cclass_03);
      pcVar10 = extraout_RDX_07;
      if (iVar3 != 0) {
        do {
          iVar8 = G->pos;
          iVar7 = G->thunkpos;
          iVar5 = yymatchClass(G,(uchar *)"",pcVar10);
          pcVar10 = extraout_RDX_08;
        } while (iVar5 != 0);
        G->pos = iVar8;
        G->thunkpos = iVar7;
        yyText(G,G->begin,G->end);
        iVar8 = G->pos;
        iVar7 = G->begin;
        G->end = iVar8;
        pcVar9 = yy_2_integer;
        pcVar10 = "yy_2_integer";
        goto LAB_00107c5b;
      }
    }
    G->pos = iVar4;
    G->thunkpos = iVar11;
    iVar3 = yymatchString(G,"0x");
    if (iVar3 != 0) {
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar3 = yymatchClass(G,(uchar *)"",cclass_04);
      pcVar10 = extraout_RDX_09;
      if (iVar3 != 0) {
        do {
          iVar8 = G->pos;
          iVar7 = G->thunkpos;
          iVar5 = yymatchClass(G,(uchar *)"",pcVar10);
          pcVar10 = extraout_RDX_10;
        } while (iVar5 != 0);
        G->pos = iVar8;
        G->thunkpos = iVar7;
        yyText(G,G->begin,G->end);
        iVar8 = G->pos;
        iVar7 = G->begin;
        G->end = iVar8;
        pcVar9 = yy_3_integer;
        pcVar10 = "yy_3_integer";
        goto LAB_00107c5b;
      }
    }
    G->pos = iVar4;
    G->thunkpos = iVar11;
    iVar3 = yymatchString(G,"0o");
    if (iVar3 != 0) {
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar3 = yymatchClass(G,(uchar *)"",cclass_05);
      pcVar10 = extraout_RDX_11;
      if (iVar3 != 0) {
        do {
          iVar8 = G->pos;
          iVar7 = G->thunkpos;
          iVar5 = yymatchClass(G,(uchar *)"",pcVar10);
          pcVar10 = extraout_RDX_12;
        } while (iVar5 != 0);
        G->pos = iVar8;
        G->thunkpos = iVar7;
        yyText(G,G->begin,G->end);
        iVar8 = G->pos;
        iVar7 = G->begin;
        G->end = iVar8;
        pcVar9 = yy_4_integer;
        pcVar10 = "yy_4_integer";
        goto LAB_00107c5b;
      }
    }
    G->pos = iVar4;
    G->thunkpos = iVar11;
    iVar3 = yymatchString(G,":10<");
    if (iVar3 != 0) {
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar3 = yymatchClass(G,(uchar *)"",cclass_06);
      pcVar10 = extraout_RDX_13;
      if (iVar3 != 0) {
        do {
          iVar3 = G->pos;
          iVar2 = G->thunkpos;
          iVar6 = yymatchClass(G,(uchar *)"",pcVar10);
          pcVar10 = extraout_RDX_14;
        } while (iVar6 != 0);
        G->pos = iVar3;
        G->thunkpos = iVar2;
        yyText(G,G->begin,G->end);
        G->end = G->pos;
        iVar3 = yymatchChar(G,0x3e);
        if (iVar3 != 0) {
          iVar7 = G->begin;
          iVar8 = G->end;
          pcVar9 = yy_5_integer;
          pcVar10 = "yy_5_integer";
          goto LAB_00107c5b;
        }
      }
    }
    G->pos = iVar4;
    G->thunkpos = iVar11;
    iVar4 = yymatchChar(G,0x3a);
    if (iVar4 != 0) {
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar4 = yymatchClass(G,(uchar *)"",cclass_07);
      pcVar10 = extraout_RDX_15;
      if (iVar4 != 0) {
        do {
          iVar4 = G->pos;
          iVar11 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)"",pcVar10);
          pcVar10 = extraout_RDX_16;
        } while (iVar3 != 0);
        G->pos = iVar4;
        G->thunkpos = iVar11;
        yyText(G,G->begin,G->end);
        G->end = G->pos;
        yyDo(G,yy_1_integer_int,G->begin,G->pos,"yy_1_integer_int");
        yyDo(G,yySet,-1,0,"yySet");
        iVar4 = yymatchChar(G,0x3c);
        if (iVar4 != 0) {
          yyText(G,G->begin,G->end);
          G->begin = G->pos;
          iVar4 = yymatchClass(G,(uchar *)"",cclass_08);
          pcVar10 = extraout_RDX_17;
          if (iVar4 != 0) {
            do {
              iVar4 = G->pos;
              iVar11 = G->thunkpos;
              iVar3 = yymatchClass(G,(uchar *)"",pcVar10);
              pcVar10 = extraout_RDX_18;
            } while (iVar3 != 0);
            G->pos = iVar4;
            G->thunkpos = iVar11;
            yyText(G,G->begin,G->end);
            G->end = G->pos;
            iVar4 = yymatchChar(G,0x3e);
            if (iVar4 != 0) {
              iVar7 = G->begin;
              iVar8 = G->end;
              pcVar9 = yy_6_integer;
              pcVar10 = "yy_6_integer";
              goto LAB_00107c5b;
            }
          }
        }
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar1;
    iVar4 = yymatchString(G,"qp{");
    if (iVar4 != 0) {
      yyDo(G,yy_1_path,G->begin,G->end,"yy_1_path");
      iVar4 = G->pos;
      iVar11 = G->thunkpos;
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_2a54,cclass_09);
      pcVar10 = extraout_RDX_19;
      if (iVar3 == 0) {
        G->pos = iVar4;
        G->thunkpos = iVar11;
        iVar4 = yy_esc(G);
        if ((iVar4 == 0) || (iVar4 = yymatchChar(G,0x7d), iVar4 == 0)) goto LAB_00107ebb;
        iVar4 = G->begin;
        iVar11 = G->end;
        pcVar9 = yy_3_path;
        pcVar10 = "yy_3_path";
      }
      else {
        do {
          iVar4 = G->pos;
          iVar11 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_2a54,pcVar10);
          pcVar10 = extraout_RDX_20;
        } while (iVar3 != 0);
        G->pos = iVar4;
        G->thunkpos = iVar11;
        yyText(G,G->begin,G->end);
        iVar11 = G->pos;
        iVar4 = G->begin;
        G->end = iVar11;
        pcVar9 = yy_2_path;
        pcVar10 = "yy_2_path";
      }
      yyDo(G,pcVar9,iVar4,iVar11,pcVar10);
      while( true ) {
        while( true ) {
          iVar4 = G->pos;
          iVar11 = G->thunkpos;
          yyText(G,G->begin,G->end);
          G->begin = G->pos;
          iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_2a54,cclass_10);
          pcVar10 = extraout_RDX_21;
          if (iVar3 == 0) break;
          do {
            iVar4 = G->pos;
            iVar11 = G->thunkpos;
            iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_2a54,pcVar10);
            pcVar10 = extraout_RDX_22;
          } while (iVar3 != 0);
          G->pos = iVar4;
          G->thunkpos = iVar11;
          yyText(G,G->begin,G->end);
          G->end = G->pos;
          yyDo(G,yy_2_path,G->begin,G->pos,"yy_2_path");
        }
        G->pos = iVar4;
        G->thunkpos = iVar11;
        iVar3 = yy_esc(G);
        if ((iVar3 == 0) || (iVar3 = yymatchChar(G,0x7d), iVar3 == 0)) break;
        yyDo(G,yy_3_path,G->begin,G->end,"yy_3_path");
      }
      G->pos = iVar4;
      G->thunkpos = iVar11;
      iVar4 = yymatchChar(G,0x7d);
      if (iVar4 != 0) goto LAB_00107c7e;
    }
LAB_00107ebb:
    G->pos = iVar5;
    G->thunkpos = iVar1;
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar4 = yymatchClass(G,(uchar *)"",cclass_11);
    pcVar10 = extraout_RDX_23;
    if (iVar4 != 0) {
      do {
        iVar4 = G->pos;
        iVar11 = G->thunkpos;
        iVar3 = yymatchClass(G,(uchar *)"",pcVar10);
        pcVar10 = extraout_RDX_24;
      } while (iVar3 != 0);
      G->pos = iVar4;
      G->thunkpos = iVar11;
      iVar3 = yymatchChar(G,0x2e);
      if (iVar3 != 0) {
        iVar3 = yymatchClass(G,(uchar *)"",cclass_12);
        pcVar10 = extraout_RDX_25;
        while (iVar3 != 0) {
          iVar4 = G->pos;
          iVar11 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)"",pcVar10);
          pcVar10 = extraout_RDX_26;
        }
      }
      G->pos = iVar4;
      G->thunkpos = iVar11;
      iVar4 = yymatchChar(G,0x65);
      if (iVar4 != 0) {
        iVar4 = G->pos;
        iVar11 = G->thunkpos;
        iVar3 = yymatchChar(G,0x2d);
        if (iVar3 == 0) {
          G->pos = iVar4;
          G->thunkpos = iVar11;
        }
        iVar4 = yymatchClass(G,(uchar *)"",cclass_13);
        pcVar10 = extraout_RDX_27;
        if (iVar4 != 0) {
          do {
            iVar8 = G->pos;
            iVar7 = G->thunkpos;
            iVar5 = yymatchClass(G,(uchar *)"",pcVar10);
            pcVar10 = extraout_RDX_28;
          } while (iVar5 != 0);
          G->pos = iVar8;
          G->thunkpos = iVar7;
          yyText(G,G->begin,G->end);
          iVar7 = G->pos;
          iVar8 = G->begin;
          G->end = iVar7;
          pcVar9 = yy_1_dec_number;
          pcVar10 = "yy_1_dec_number";
          goto LAB_00107c79;
        }
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar1;
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar4 = yymatchClass(G,(uchar *)"",cclass_14);
    if ((iVar4 == 0) ||
       (iVar4 = yymatchClass(G,(uchar *)"",cclass_15), pcVar10 = extraout_RDX_29, iVar4 == 0)) {
      G->pos = iVar5;
      G->thunkpos = iVar1;
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar4 = yymatchClass(G,(uchar *)"",cclass_16);
      pcVar10 = extraout_RDX_31;
      if (iVar4 != 0) {
        do {
          iVar4 = G->pos;
          iVar11 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)"",pcVar10);
          pcVar10 = extraout_RDX_32;
        } while (iVar3 != 0);
        G->pos = iVar4;
        G->thunkpos = iVar11;
        iVar4 = yymatchChar(G,0x2e);
        if ((iVar4 != 0) &&
           (iVar4 = yymatchClass(G,(uchar *)"",cclass_17), pcVar10 = extraout_RDX_33, iVar4 != 0)) {
          do {
            iVar8 = G->pos;
            iVar7 = G->thunkpos;
            iVar5 = yymatchClass(G,(uchar *)"",pcVar10);
            pcVar10 = extraout_RDX_34;
          } while (iVar5 != 0);
          G->pos = iVar8;
          G->thunkpos = iVar7;
          yyText(G,G->begin,G->end);
          iVar7 = G->pos;
          iVar8 = G->begin;
          G->end = iVar7;
          pcVar9 = yy_3_dec_number;
          pcVar10 = "yy_3_dec_number";
          goto LAB_00107c79;
        }
      }
      G->pos = iVar5;
      G->thunkpos = iVar1;
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar4 = yymatchClass(G,(uchar *)"",cclass_18);
      pcVar10 = extraout_RDX_35;
      if (iVar4 == 0) {
        G->pos = iVar5;
        G->thunkpos = iVar1;
        iVar4 = yy_string(G);
        if (iVar4 != 0) goto LAB_00107c7e;
        G->pos = iVar5;
        G->thunkpos = iVar1;
        iVar4 = yymatchChar(G,0x28);
        if (iVar4 != 0) {
          yy__(G);
          iVar4 = yy_expr(G);
          if (iVar4 != 0) {
            yyDo(G,yySet,-3,0,"yySet");
            yy__(G);
            iVar4 = yymatchChar(G,0x29);
            if (iVar4 != 0) {
              iVar8 = G->begin;
              iVar7 = G->end;
              pcVar9 = yy_1_term;
              pcVar10 = "yy_1_term";
              goto LAB_00107c79;
            }
          }
        }
        G->pos = iVar5;
        G->thunkpos = iVar1;
        iVar4 = yy_variable(G);
        if (iVar4 != 0) goto LAB_00107c7e;
        G->pos = iVar5;
        G->thunkpos = iVar1;
        iVar4 = yymatchString(G,"$?LINE");
        if (iVar4 != 0) {
          iVar8 = G->begin;
          iVar7 = G->end;
          pcVar9 = yy_2_term;
          pcVar10 = "yy_2_term";
          goto LAB_00107c79;
        }
        G->pos = iVar5;
        G->thunkpos = iVar1;
        yyDo(G,yyPush,1,0,"yyPush");
        iVar4 = G->pos;
        iVar11 = G->thunkpos;
        iVar3 = yymatchChar(G,0x5b);
        if (iVar3 != 0) {
          yy__(G);
          iVar3 = yy_expr(G);
          if (iVar3 != 0) {
            yyDo(G,yySet,-1,0,"yySet");
            yy__(G);
            iVar3 = yymatchChar(G,0x5d);
            if (iVar3 != 0) {
              iVar7 = G->begin;
              iVar8 = G->end;
              pcVar9 = yy_1_array;
              pcVar10 = "yy_1_array";
              goto LAB_00107c5b;
            }
          }
        }
        G->pos = iVar4;
        G->thunkpos = iVar11;
        iVar4 = yymatchChar(G,0x5b);
        if (iVar4 != 0) {
          yy__(G);
          iVar4 = yymatchChar(G,0x5d);
          if (iVar4 != 0) {
            iVar7 = G->begin;
            iVar8 = G->end;
            pcVar9 = yy_2_array;
            pcVar10 = "yy_2_array";
            goto LAB_00107c5b;
          }
        }
        G->pos = iVar5;
        G->thunkpos = iVar1;
        yyDo(G,yyPush,1,0,"yyPush");
        iVar4 = G->pos;
        iVar11 = G->thunkpos;
        iVar3 = yymatchString(G,"augment");
        if ((iVar3 != 0) && (iVar3 = yy_ws(G), iVar3 != 0)) {
          do {
            iVar3 = G->pos;
            iVar2 = G->thunkpos;
            iVar6 = yy_ws(G);
          } while (iVar6 != 0);
          G->pos = iVar3;
          G->thunkpos = iVar2;
          iVar3 = yy_class_declare(G);
          if (iVar3 != 0) {
            yyDo(G,yySet,-1,0,"yySet");
            iVar7 = G->begin;
            iVar8 = G->end;
            pcVar9 = yy_1_class;
            pcVar10 = "yy_1_class";
            goto LAB_00107c5b;
          }
        }
        G->pos = iVar4;
        G->thunkpos = iVar11;
        iVar4 = yy_class_declare(G);
        if (iVar4 != 0) goto LAB_00107c63;
        G->pos = iVar5;
        G->thunkpos = iVar1;
        yyDo(G,yyPush,2,0,"yyPush");
        iVar4 = yymatchString(G,"role");
        if ((iVar4 != 0) && (iVar4 = yy_ws(G), iVar4 != 0)) {
          do {
            iVar4 = G->pos;
            iVar11 = G->thunkpos;
            iVar3 = yy_ws(G);
          } while (iVar3 != 0);
          G->pos = iVar4;
          G->thunkpos = iVar11;
          iVar4 = yy_ident(G);
          if (iVar4 == 0) goto LAB_0010851b;
          yyDo(G,yySet,-2,0,"yySet");
          yy__(G);
          iVar4 = yy_block(G);
          if (iVar4 == 0) goto LAB_0010851b;
          yyDo(G,yySet,-1,0,"yySet");
          iVar8 = G->begin;
          iVar7 = G->end;
          pcVar9 = yy_1_role;
          pcVar10 = "yy_1_role";
LAB_0010886a:
          yyDo(G,pcVar9,iVar8,iVar7,pcVar10);
          iVar8 = 2;
          goto LAB_00107c73;
        }
LAB_0010851b:
        G->pos = iVar5;
        G->thunkpos = iVar1;
        yyDo(G,yyPush,2,0,"yyPush");
        iVar4 = G->pos;
        iVar11 = G->thunkpos;
        iVar3 = yy_reserved(G);
        if (iVar3 == 0) {
          G->pos = iVar4;
          G->thunkpos = iVar11;
          iVar3 = yy_ident(G);
          if (iVar3 != 0) {
            yyDo(G,yySet,-2,0,"yySet");
            yy__(G);
            iVar3 = yy_paren_args(G);
            if (iVar3 != 0) {
              yyDo(G,yySet,-1,0,"yySet");
              iVar8 = G->begin;
              iVar7 = G->end;
              pcVar9 = yy_1_funcall;
              pcVar10 = "yy_1_funcall";
              goto LAB_0010886a;
            }
          }
        }
        G->pos = iVar4;
        G->thunkpos = iVar11;
        iVar3 = yy_reserved(G);
        if (iVar3 == 0) {
          G->pos = iVar4;
          G->thunkpos = iVar11;
          iVar4 = yy_ident(G);
          if (iVar4 != 0) {
            yyDo(G,yySet,-2,0,"yySet");
            iVar4 = yy_ws(G);
            if (iVar4 != 0) {
              do {
                iVar4 = G->pos;
                iVar11 = G->thunkpos;
                iVar3 = yy_ws(G);
              } while (iVar3 != 0);
              G->pos = iVar4;
              G->thunkpos = iVar11;
              iVar3 = yymatchChar(G,0x7b);
              if (iVar3 == 0) {
                G->pos = iVar4;
                G->thunkpos = iVar11;
                iVar4 = yy_bare_args(G);
                if (iVar4 != 0) {
                  yyDo(G,yySet,-1,0,"yySet");
                  iVar8 = G->begin;
                  iVar7 = G->end;
                  pcVar9 = yy_2_funcall;
                  pcVar10 = "yy_2_funcall";
                  goto LAB_0010886a;
                }
              }
            }
          }
        }
        G->pos = iVar5;
        G->thunkpos = iVar1;
        iVar4 = yy_qw(G);
        if (iVar4 != 0) goto LAB_00107c7e;
        G->pos = iVar5;
        G->thunkpos = iVar1;
        yyDo(G,yyPush,2,0,"yyPush");
        iVar4 = G->pos;
        iVar11 = G->thunkpos;
        iVar3 = yymatchChar(G,0x7b);
        if (iVar3 != 0) {
          yy__(G);
          iVar3 = yy_pair(G);
          if (iVar3 != 0) {
            yyDo(G,yySet,-2,0,"yySet");
            yyDo(G,yy_1_hash,G->begin,G->end,"yy_1_hash");
            while( true ) {
              iVar3 = G->pos;
              iVar2 = G->thunkpos;
              yy__(G);
              iVar6 = yymatchChar(G,0x2c);
              if (iVar6 == 0) break;
              yy__(G);
              iVar6 = yy_pair(G);
              if (iVar6 == 0) break;
              yyDo(G,yySet,-1,0,"yySet");
              yyDo(G,yy_2_hash,G->begin,G->end,"yy_2_hash");
            }
            G->pos = iVar3;
            G->thunkpos = iVar2;
            iVar6 = yymatchChar(G,0x2c);
            if (iVar6 == 0) {
              G->pos = iVar3;
              G->thunkpos = iVar2;
            }
            yy__(G);
            iVar3 = yymatchChar(G,0x7d);
            if (iVar3 != 0) {
              iVar8 = G->begin;
              iVar7 = G->end;
              pcVar9 = yy_3_hash;
              pcVar10 = "yy_3_hash";
              goto LAB_0010886a;
            }
          }
        }
        G->pos = iVar4;
        G->thunkpos = iVar11;
        iVar4 = yymatchChar(G,0x7b);
        if (iVar4 != 0) {
          yy__(G);
          iVar4 = yymatchChar(G,0x7d);
          if (iVar4 != 0) {
            iVar8 = G->begin;
            iVar7 = G->end;
            pcVar9 = yy_4_hash;
            pcVar10 = "yy_4_hash";
            goto LAB_0010886a;
          }
        }
        G->pos = iVar5;
        G->thunkpos = iVar1;
        iVar4 = yy_lambda(G);
        if (iVar4 != 0) goto LAB_00107c7e;
        G->pos = iVar5;
        G->thunkpos = iVar1;
        yyDo(G,yyPush,2,0,"yyPush");
        iVar4 = yymatchChar(G,0x2e);
        if ((iVar4 != 0) && (iVar4 = yy_ident(G), iVar4 != 0)) {
          yyDo(G,yySet,-2,0,"yySet");
          yyDo(G,yy_1_it_method,G->begin,G->end,"yy_1_it_method");
          iVar8 = G->pos;
          iVar7 = G->thunkpos;
          iVar5 = yy_paren_args(G);
          if (iVar5 == 0) {
            G->pos = iVar8;
            G->thunkpos = iVar7;
          }
          else {
            yyDo(G,yySet,-1,0,"yySet");
            yyDo(G,yy_2_it_method,G->begin,G->end,"yy_2_it_method");
          }
          iVar8 = G->begin;
          iVar7 = G->end;
          pcVar9 = yy_3_it_method;
          pcVar10 = "yy_3_it_method";
          goto LAB_0010886a;
        }
        G->pos = iVar5;
        G->thunkpos = iVar1;
        yyDo(G,yyPush,1,0,"yyPush");
        iVar4 = yymatchString(G,"enum");
        if ((iVar4 != 0) && (iVar4 = yy_ws(G), iVar4 != 0)) {
          do {
            iVar4 = G->pos;
            iVar11 = G->thunkpos;
            iVar3 = yy_ws(G);
          } while (iVar3 != 0);
          G->pos = iVar4;
          G->thunkpos = iVar11;
          iVar4 = yy_qw(G);
          if (iVar4 != 0) {
            yyDo(G,yySet,-1,0,"yySet");
            iVar7 = G->begin;
            iVar8 = G->end;
            pcVar9 = yy_1_enum;
            pcVar10 = "yy_1_enum";
            goto LAB_00107c5b;
          }
        }
        G->pos = iVar5;
        G->thunkpos = iVar1;
        iVar4 = yymatchString(G,"pi");
        if (iVar4 != 0) {
          iVar4 = G->pos;
          iVar11 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)"",cclass_19);
          if (iVar3 == 0) {
            G->pos = iVar4;
            G->thunkpos = iVar11;
            iVar8 = G->begin;
            iVar7 = G->end;
            pcVar9 = yy_3_term;
            pcVar10 = "yy_3_term";
            goto LAB_00107c79;
          }
        }
        G->pos = iVar5;
        G->thunkpos = iVar1;
        iVar4 = yymatchChar(G,0x65);
        if (iVar4 != 0) {
          iVar4 = G->pos;
          iVar11 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)"",cclass_20);
          if (iVar3 == 0) {
            G->pos = iVar4;
            G->thunkpos = iVar11;
            iVar8 = G->begin;
            iVar7 = G->end;
            pcVar9 = yy_4_term;
            pcVar10 = "yy_4_term";
            goto LAB_00107c79;
          }
        }
        G->pos = iVar5;
        G->thunkpos = iVar1;
        iVar4 = yymatchString(G,"try");
        if ((iVar4 != 0) && (iVar4 = yy_ws(G), iVar4 != 0)) {
          yy__(G);
          iVar4 = yy_block(G);
          if (iVar4 != 0) {
            yyDo(G,yySet,-2,0,"yySet");
            iVar8 = G->begin;
            iVar7 = G->end;
            pcVar9 = yy_5_term;
            pcVar10 = "yy_5_term";
            goto LAB_00107c79;
          }
        }
        G->pos = iVar5;
        G->thunkpos = iVar1;
        iVar4 = yymatchString(G,"try");
        if ((iVar4 != 0) && (iVar4 = yy_ws(G), iVar4 != 0)) {
          do {
            iVar4 = G->pos;
            iVar11 = G->thunkpos;
            iVar3 = yy_ws(G);
          } while (iVar3 != 0);
          G->pos = iVar4;
          G->thunkpos = iVar11;
          iVar4 = yy_expr(G);
          if (iVar4 != 0) {
            yyDo(G,yySet,-2,0,"yySet");
            iVar8 = G->begin;
            iVar7 = G->end;
            pcVar9 = yy_6_term;
            pcVar10 = "yy_6_term";
            goto LAB_00107c79;
          }
        }
        G->pos = iVar5;
        G->thunkpos = iVar1;
        yyDo(G,yyPush,1,0,"yyPush");
        iVar4 = yymatchString(G,"m:P5/");
        if (iVar4 != 0) {
          yyDo(G,yy_1_perl5_regexp_start,G->begin,G->end,"yy_1_perl5_regexp_start");
          yyDo(G,yySet,-1,0,"yySet");
          iVar4 = G->pos;
          iVar11 = G->thunkpos;
          yyText(G,G->begin,G->end);
          G->begin = G->pos;
          iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_3ebc,cclass_21);
          pcVar10 = extraout_RDX_37;
          if (iVar3 == 0) {
            G->pos = iVar4;
            G->thunkpos = iVar11;
            iVar4 = yy_esc(G);
            if ((iVar4 == 0) || (iVar4 = yymatchChar(G,0x2f), iVar4 == 0)) goto LAB_00108e19;
            iVar4 = G->begin;
            iVar11 = G->end;
            pcVar9 = yy_2_perl5_regexp;
            pcVar10 = "yy_2_perl5_regexp";
          }
          else {
            do {
              iVar4 = G->pos;
              iVar11 = G->thunkpos;
              iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_3ebc,pcVar10);
              pcVar10 = extraout_RDX_38;
            } while (iVar3 != 0);
            G->pos = iVar4;
            G->thunkpos = iVar11;
            yyText(G,G->begin,G->end);
            iVar11 = G->pos;
            iVar4 = G->begin;
            G->end = iVar11;
            pcVar9 = yy_1_perl5_regexp;
            pcVar10 = "yy_1_perl5_regexp";
          }
          yyDo(G,pcVar9,iVar4,iVar11,pcVar10);
          while( true ) {
            while( true ) {
              iVar4 = G->pos;
              iVar11 = G->thunkpos;
              yyText(G,G->begin,G->end);
              G->begin = G->pos;
              iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_3ebc,cclass_22);
              pcVar10 = extraout_RDX_39;
              if (iVar3 == 0) break;
              do {
                iVar4 = G->pos;
                iVar11 = G->thunkpos;
                iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_3ebc,pcVar10);
                pcVar10 = extraout_RDX_40;
              } while (iVar3 != 0);
              G->pos = iVar4;
              G->thunkpos = iVar11;
              yyText(G,G->begin,G->end);
              G->end = G->pos;
              yyDo(G,yy_1_perl5_regexp,G->begin,G->pos,"yy_1_perl5_regexp");
            }
            G->pos = iVar4;
            G->thunkpos = iVar11;
            iVar3 = yy_esc(G);
            if ((iVar3 == 0) || (iVar3 = yymatchChar(G,0x2f), iVar3 == 0)) break;
            yyDo(G,yy_2_perl5_regexp,G->begin,G->end,"yy_2_perl5_regexp");
          }
          G->pos = iVar4;
          G->thunkpos = iVar11;
          iVar4 = yymatchChar(G,0x2f);
          if (iVar4 != 0) {
            iVar7 = G->begin;
            iVar8 = G->end;
            pcVar9 = yy_3_perl5_regexp;
            pcVar10 = "yy_3_perl5_regexp";
            goto LAB_00107c5b;
          }
        }
LAB_00108e19:
        G->pos = iVar5;
        G->thunkpos = iVar1;
        iVar4 = yymatchString(G,"m:P5/./");
        if (iVar4 != 0) {
          iVar8 = G->begin;
          iVar7 = G->end;
          pcVar9 = yy_7_term;
          pcVar10 = "yy_7_term";
          goto LAB_00107c79;
        }
        G->pos = iVar5;
        G->thunkpos = iVar1;
        yyDo(G,yyPush,1,0,"yyPush");
        iVar4 = G->pos;
        iVar11 = G->thunkpos;
        iVar3 = yymatchString(G,"m/");
        if (iVar3 == 0) {
          G->pos = iVar4;
          G->thunkpos = iVar11;
          iVar4 = yymatchChar(G,0x2f);
          if (iVar4 != 0) goto LAB_00108eae;
        }
        else {
LAB_00108eae:
          yyDo(G,yy_1_regexp_start,G->begin,G->end,"yy_1_regexp_start");
          yyDo(G,yySet,-1,0,"yySet");
          iVar4 = G->pos;
          iVar11 = G->thunkpos;
          yyText(G,G->begin,G->end);
          G->begin = G->pos;
          iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_3ebc,cclass_23);
          pcVar10 = extraout_RDX_41;
          if (iVar3 == 0) {
            G->pos = iVar4;
            G->thunkpos = iVar11;
            iVar4 = yy_esc(G);
            if ((iVar4 == 0) || (iVar4 = yymatchChar(G,0x2f), iVar4 == 0)) goto LAB_00109098;
            iVar4 = G->begin;
            iVar11 = G->end;
            pcVar9 = yy_2_regexp;
            pcVar10 = "yy_2_regexp";
          }
          else {
            do {
              iVar4 = G->pos;
              iVar11 = G->thunkpos;
              iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_3ebc,pcVar10);
              pcVar10 = extraout_RDX_42;
            } while (iVar3 != 0);
            G->pos = iVar4;
            G->thunkpos = iVar11;
            yyText(G,G->begin,G->end);
            iVar11 = G->pos;
            iVar4 = G->begin;
            G->end = iVar11;
            pcVar9 = yy_1_regexp;
            pcVar10 = "yy_1_regexp";
          }
          yyDo(G,pcVar9,iVar4,iVar11,pcVar10);
          while( true ) {
            while( true ) {
              iVar4 = G->pos;
              iVar11 = G->thunkpos;
              yyText(G,G->begin,G->end);
              G->begin = G->pos;
              iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_3ebc,cclass_24);
              pcVar10 = extraout_RDX_43;
              if (iVar3 == 0) break;
              do {
                iVar4 = G->pos;
                iVar11 = G->thunkpos;
                iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_3ebc,pcVar10);
                pcVar10 = extraout_RDX_44;
              } while (iVar3 != 0);
              G->pos = iVar4;
              G->thunkpos = iVar11;
              yyText(G,G->begin,G->end);
              G->end = G->pos;
              yyDo(G,yy_1_regexp,G->begin,G->pos,"yy_1_regexp");
            }
            G->pos = iVar4;
            G->thunkpos = iVar11;
            iVar3 = yy_esc(G);
            if ((iVar3 == 0) || (iVar3 = yymatchChar(G,0x2f), iVar3 == 0)) break;
            yyDo(G,yy_2_regexp,G->begin,G->end,"yy_2_regexp");
          }
          G->pos = iVar4;
          G->thunkpos = iVar11;
          iVar4 = yymatchChar(G,0x2f);
          if (iVar4 != 0) {
            iVar7 = G->begin;
            iVar8 = G->end;
            pcVar9 = yy_3_regexp;
            pcVar10 = "yy_3_regexp";
            goto LAB_00107c5b;
          }
        }
LAB_00109098:
        G->pos = iVar5;
        G->thunkpos = iVar1;
        iVar4 = yymatchString(G,"True");
        if (iVar4 != 0) {
          iVar4 = G->pos;
          iVar11 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)"",cclass_25);
          if (iVar3 == 0) {
            G->pos = iVar4;
            G->thunkpos = iVar11;
            iVar8 = G->begin;
            iVar7 = G->end;
            pcVar9 = yy_8_term;
            pcVar10 = "yy_8_term";
            goto LAB_00107c79;
          }
        }
        G->pos = iVar5;
        G->thunkpos = iVar1;
        iVar4 = yymatchString(G,"False");
        if (iVar4 != 0) {
          iVar4 = G->pos;
          iVar11 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)"",cclass_26);
          if (iVar3 == 0) {
            G->pos = iVar4;
            G->thunkpos = iVar11;
            iVar8 = G->begin;
            iVar7 = G->end;
            pcVar9 = yy_9_term;
            pcVar10 = "yy_9_term";
            goto LAB_00107c79;
          }
        }
        G->pos = iVar5;
        G->thunkpos = iVar1;
        iVar4 = yy_reserved(G);
        if (iVar4 == 0) {
          G->pos = iVar5;
          G->thunkpos = iVar1;
          iVar4 = yy_ident(G);
          if (iVar4 != 0) goto LAB_00107c7e;
        }
        G->pos = iVar5;
        G->thunkpos = iVar1;
        yyText(G,G->begin,G->end);
        G->begin = G->pos;
        iVar4 = yymatchString(G,"class");
        if (iVar4 == 0) {
          G->pos = iVar5;
          G->thunkpos = iVar1;
          iVar4 = yy_pair(G);
          if (iVar4 != 0) goto LAB_00107c7e;
          G->pos = iVar5;
          G->thunkpos = iVar1;
          iVar4 = yymatchChar(G,0x5c);
          if ((iVar4 == 0) || (iVar4 = yy_term(G), iVar4 == 0)) {
            G->pos = iVar5;
            G->thunkpos = iVar1;
            iVar4 = yymatchChar(G,0x28);
            if (iVar4 != 0) {
              yy__(G);
              iVar4 = yymatchChar(G,0x29);
              if (iVar4 != 0) {
                iVar8 = G->begin;
                iVar7 = G->end;
                pcVar9 = yy_12_term;
                pcVar10 = "yy_12_term";
                goto LAB_00107c79;
              }
            }
            G->pos = iVar5;
            G->thunkpos = iVar1;
            iVar4 = yy_funcref(G);
            if (iVar4 != 0) goto LAB_00107c7e;
            G->pos = iVar5;
            G->thunkpos = iVar1;
            yyText(G,G->begin,G->end);
            G->begin = G->pos;
            iVar4 = yymatchString(G,"$~");
            if ((iVar4 == 0) ||
               (iVar4 = yymatchClass(G,(uchar *)"",cclass_27), pcVar10 = extraout_RDX_45, iVar4 == 0
               )) {
              G->pos = iVar5;
              G->thunkpos = iVar1;
              iVar4 = yymatchChar(G,0x2a);
              if (iVar4 != 0) {
                iVar4 = G->pos;
                iVar11 = G->thunkpos;
                iVar3 = yymatchClass(G,(uchar *)"",cclass_28);
                if (iVar3 == 0) {
                  G->pos = iVar4;
                  G->thunkpos = iVar11;
                  iVar8 = G->begin;
                  iVar7 = G->end;
                  pcVar9 = yy_14_term;
                  pcVar10 = "yy_14_term";
                  goto LAB_00107c79;
                }
              }
              G->pos = iVar5;
              G->thunkpos = iVar1;
              iVar4 = yy_attr_vars(G);
              if (iVar4 != 0) goto LAB_00107c7e;
              G->pos = iVar5;
              G->thunkpos = iVar1;
              iVar4 = yymatchString(G,"rand");
              if (iVar4 != 0) {
                iVar4 = G->pos;
                iVar11 = G->thunkpos;
                iVar3 = yymatchClass(G,(uchar *)"",cclass_29);
                if (iVar3 == 0) {
                  G->pos = iVar4;
                  G->thunkpos = iVar11;
                  iVar8 = G->begin;
                  iVar7 = G->end;
                  pcVar9 = yy_15_term;
                  pcVar10 = "yy_15_term";
                  goto LAB_00107c79;
                }
              }
              G->pos = iVar5;
              G->thunkpos = iVar1;
              iVar4 = yymatchString(G,"now");
              if (iVar4 != 0) {
                iVar4 = G->pos;
                iVar11 = G->thunkpos;
                iVar3 = yymatchClass(G,(uchar *)"",cclass_30);
                if (iVar3 == 0) {
                  G->pos = iVar4;
                  G->thunkpos = iVar11;
                  iVar8 = G->begin;
                  iVar7 = G->end;
                  pcVar9 = yy_16_term;
                  pcVar10 = "yy_16_term";
                  goto LAB_00107c79;
                }
              }
              G->pos = iVar5;
              G->thunkpos = iVar1;
              iVar4 = yymatchString(G,"time");
              if (iVar4 != 0) {
                iVar4 = G->pos;
                iVar11 = G->thunkpos;
                iVar3 = yymatchClass(G,(uchar *)"",cclass_31);
                if (iVar3 == 0) {
                  G->pos = iVar4;
                  G->thunkpos = iVar11;
                  iVar8 = G->begin;
                  iVar7 = G->end;
                  pcVar9 = yy_17_term;
                  pcVar10 = "yy_17_term";
                  goto LAB_00107c79;
                }
              }
              G->pos = iVar5;
              G->thunkpos = iVar1;
              yyDo(G,yy_18_term,G->begin,G->end,"yy_18_term");
              iVar4 = yymatchString(G,"$(");
              if (iVar4 != 0) {
                yy__(G);
                iVar4 = G->pos;
                iVar11 = G->thunkpos;
                iVar3 = yy_expr(G);
                if (iVar3 == 0) {
                  G->pos = iVar4;
                  G->thunkpos = iVar11;
                }
                else {
                  yyDo(G,yySet,-3,0,"yySet");
                  yy__(G);
                }
                iVar4 = yymatchChar(G,0x29);
                if (iVar4 != 0) {
                  iVar8 = G->begin;
                  iVar7 = G->end;
                  pcVar9 = yy_19_term;
                  pcVar10 = "yy_19_term";
                  goto LAB_00107c79;
                }
              }
              G->pos = iVar5;
              G->thunkpos = iVar1;
              yyDo(G,yy_20_term,G->begin,G->end,"yy_20_term");
              iVar4 = yymatchString(G,"@(");
              if (iVar4 != 0) {
                yy__(G);
                iVar4 = G->pos;
                iVar11 = G->thunkpos;
                iVar3 = yy_expr(G);
                if (iVar3 == 0) {
                  G->pos = iVar4;
                  G->thunkpos = iVar11;
                }
                else {
                  yyDo(G,yySet,-3,0,"yySet");
                  yy__(G);
                }
                iVar4 = yymatchChar(G,0x29);
                if (iVar4 != 0) {
                  iVar8 = G->begin;
                  iVar7 = G->end;
                  pcVar9 = yy_21_term;
                  pcVar10 = "yy_21_term";
                  goto LAB_00107c79;
                }
              }
              G->pos = iVar5;
              G->thunkpos = iVar1;
              yyDo(G,yy_22_term,G->begin,G->end,"yy_22_term");
              iVar5 = yymatchString(G,"%(");
              if (iVar5 == 0) {
LAB_001096ef:
                G->pos = iVar8;
                G->thunkpos = iVar7;
                return 0;
              }
              yy__(G);
              iVar5 = G->pos;
              iVar1 = G->thunkpos;
              iVar4 = yy_expr(G);
              if (iVar4 == 0) {
                G->pos = iVar5;
                G->thunkpos = iVar1;
              }
              else {
                yyDo(G,yySet,-3,0,"yySet");
                yy__(G);
              }
              iVar5 = yymatchChar(G,0x29);
              if (iVar5 == 0) goto LAB_001096ef;
              iVar8 = G->begin;
              iVar7 = G->end;
              pcVar9 = yy_23_term;
              pcVar10 = "yy_23_term";
            }
            else {
              do {
                iVar8 = G->pos;
                iVar7 = G->thunkpos;
                iVar5 = yymatchClass(G,(uchar *)"",pcVar10);
                pcVar10 = extraout_RDX_46;
              } while (iVar5 != 0);
              G->pos = iVar8;
              G->thunkpos = iVar7;
              yyText(G,G->begin,G->end);
              iVar7 = G->pos;
              iVar8 = G->begin;
              G->end = iVar7;
              pcVar9 = yy_13_term;
              pcVar10 = "yy_13_term";
            }
          }
          else {
            yyDo(G,yySet,-1,0,"yySet");
            iVar8 = G->begin;
            iVar7 = G->end;
            pcVar9 = yy_11_term;
            pcVar10 = "yy_11_term";
          }
        }
        else {
          yyText(G,G->begin,G->end);
          iVar7 = G->pos;
          iVar8 = G->begin;
          G->end = iVar7;
          pcVar9 = yy_10_term;
          pcVar10 = "yy_10_term";
        }
      }
      else {
        do {
          iVar8 = G->pos;
          iVar7 = G->thunkpos;
          iVar5 = yymatchClass(G,(uchar *)"",pcVar10);
          pcVar10 = extraout_RDX_36;
        } while (iVar5 != 0);
        G->pos = iVar8;
        G->thunkpos = iVar7;
        yyText(G,G->begin,G->end);
        iVar7 = G->pos;
        iVar8 = G->begin;
        G->end = iVar7;
        pcVar9 = yy_4_dec_number;
        pcVar10 = "yy_4_dec_number";
      }
    }
    else {
      do {
        iVar8 = G->pos;
        iVar7 = G->thunkpos;
        iVar5 = yymatchClass(G,(uchar *)"",pcVar10);
        pcVar10 = extraout_RDX_30;
      } while (iVar5 != 0);
      G->pos = iVar8;
      G->thunkpos = iVar7;
      yyText(G,G->begin,G->end);
      iVar7 = G->pos;
      iVar8 = G->begin;
      G->end = iVar7;
      pcVar9 = yy_2_dec_number;
      pcVar10 = "yy_2_dec_number";
    }
  }
  else {
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar3 = yymatchClass(G,(uchar *)"",cclass_02);
    pcVar10 = extraout_RDX_05;
    if (iVar3 == 0) goto LAB_001078a9;
    do {
      iVar8 = G->pos;
      iVar7 = G->thunkpos;
      iVar5 = yymatchClass(G,(uchar *)"",pcVar10);
      pcVar10 = extraout_RDX_06;
    } while (iVar5 != 0);
    G->pos = iVar8;
    G->thunkpos = iVar7;
    yyText(G,G->begin,G->end);
    iVar8 = G->pos;
    iVar7 = G->begin;
    G->end = iVar8;
    pcVar9 = yy_1_integer;
    pcVar10 = "yy_1_integer";
LAB_00107c5b:
    yyDo(G,pcVar9,iVar7,iVar8,pcVar10);
LAB_00107c63:
    iVar8 = 1;
LAB_00107c73:
    pcVar10 = "yyPop";
    pcVar9 = yyPop;
    iVar7 = 0;
  }
LAB_00107c79:
  yyDo(G,pcVar9,iVar8,iVar7,pcVar10);
LAB_00107c7e:
  yyDo(G,yyPop,3,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_term(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 3, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "term"));

  {  int yypos451= G->pos, yythunkpos451= G->thunkpos;  if (!yy_complex(G))  goto l452;
  goto l451;
  l452:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_integer(G))  goto l453;
  goto l451;
  l453:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_path(G))  goto l454;
  goto l451;
  l454:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_dec_number(G))  goto l455;
  goto l451;
  l455:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_string(G))  goto l456;
  goto l451;
  l456:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchChar(G, '(')) goto l457;
  if (!yy__(G))  goto l457;
  if (!yy_expr(G))  goto l457;
  yyDo(G, yySet, -3, 0, "yySet");
  if (!yy__(G))  goto l457;
  if (!yymatchChar(G, ')')) goto l457;
  yyDo(G, yy_1_term, G->begin, G->end, "yy_1_term");
  goto l451;
  l457:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_variable(G))  goto l458;
  goto l451;
  l458:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "$?LINE")) goto l459;
  yyDo(G, yy_2_term, G->begin, G->end, "yy_2_term");
  goto l451;
  l459:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_array(G))  goto l460;
  goto l451;
  l460:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_class(G))  goto l461;
  goto l451;
  l461:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_role(G))  goto l462;
  goto l451;
  l462:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_funcall(G))  goto l463;
  goto l451;
  l463:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_qw(G))  goto l464;
  goto l451;
  l464:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_hash(G))  goto l465;
  goto l451;
  l465:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_lambda(G))  goto l466;
  goto l451;
  l466:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_it_method(G))  goto l467;
  goto l451;
  l467:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_enum(G))  goto l468;
  goto l451;
  l468:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "pi")) goto l469;

  {  int yypos470= G->pos, yythunkpos470= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9_")) goto l470;
  goto l469;
  l470:;	  G->pos= yypos470; G->thunkpos= yythunkpos470;
  }  yyDo(G, yy_3_term, G->begin, G->end, "yy_3_term");
  goto l451;
  l469:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchChar(G, 'e')) goto l471;

  {  int yypos472= G->pos, yythunkpos472= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9_")) goto l472;
  goto l471;
  l472:;	  G->pos= yypos472; G->thunkpos= yythunkpos472;
  }  yyDo(G, yy_4_term, G->begin, G->end, "yy_4_term");
  goto l451;
  l471:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "try")) goto l473;
  if (!yy_ws(G))  goto l473;
  if (!yy__(G))  goto l473;
  if (!yy_block(G))  goto l473;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_5_term, G->begin, G->end, "yy_5_term");
  goto l451;
  l473:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "try")) goto l474;
  if (!yy_ws(G))  goto l474;

  l475:;	
  {  int yypos476= G->pos, yythunkpos476= G->thunkpos;  if (!yy_ws(G))  goto l476;
  goto l475;
  l476:;	  G->pos= yypos476; G->thunkpos= yythunkpos476;
  }  if (!yy_expr(G))  goto l474;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_6_term, G->begin, G->end, "yy_6_term");
  goto l451;
  l474:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_perl5_regexp(G))  goto l477;
  goto l451;
  l477:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "m:P5/./")) goto l478;
  yyDo(G, yy_7_term, G->begin, G->end, "yy_7_term");
  goto l451;
  l478:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_regexp(G))  goto l479;
  goto l451;
  l479:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "True")) goto l480;

  {  int yypos481= G->pos, yythunkpos481= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9")) goto l481;
  goto l480;
  l481:;	  G->pos= yypos481; G->thunkpos= yythunkpos481;
  }  yyDo(G, yy_8_term, G->begin, G->end, "yy_8_term");
  goto l451;
  l480:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "False")) goto l482;

  {  int yypos483= G->pos, yythunkpos483= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9")) goto l483;
  goto l482;
  l483:;	  G->pos= yypos483; G->thunkpos= yythunkpos483;
  }  yyDo(G, yy_9_term, G->begin, G->end, "yy_9_term");
  goto l451;
  l482:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;
  {  int yypos485= G->pos, yythunkpos485= G->thunkpos;  if (!yy_reserved(G))  goto l485;
  goto l484;
  l485:;	  G->pos= yypos485; G->thunkpos= yythunkpos485;
  }  if (!yy_ident(G))  goto l484;
  goto l451;
  l484:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l486;  if (!yymatchString(G, "class")) goto l486;
  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l486;  yyDo(G, yy_10_term, G->begin, G->end, "yy_10_term");
  goto l451;
  l486:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_pair(G))  goto l487;
  goto l451;
  l487:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchChar(G, '\\')) goto l488;
  if (!yy_term(G))  goto l488;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_11_term, G->begin, G->end, "yy_11_term");
  goto l451;
  l488:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchChar(G, '(')) goto l489;
  if (!yy__(G))  goto l489;
  if (!yymatchChar(G, ')')) goto l489;
  yyDo(G, yy_12_term, G->begin, G->end, "yy_12_term");
  goto l451;
  l489:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_funcref(G))  goto l490;
  goto l451;
  l490:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l491;  if (!yymatchString(G, "$~")) goto l491;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "A-Za-z")) goto l491;

  l492:;	
  {  int yypos493= G->pos, yythunkpos493= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "A-Za-z0-9")) goto l493;
  goto l492;
  l493:;	  G->pos= yypos493; G->thunkpos= yythunkpos493;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l491;  yyDo(G, yy_13_term, G->begin, G->end, "yy_13_term");
  goto l451;
  l491:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchChar(G, '*')) goto l494;

  {  int yypos495= G->pos, yythunkpos495= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\004\000\040\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "*=")) goto l495;
  goto l494;
  l495:;	  G->pos= yypos495; G->thunkpos= yythunkpos495;
  }  yyDo(G, yy_14_term, G->begin, G->end, "yy_14_term");
  goto l451;
  l494:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_attr_vars(G))  goto l496;
  goto l451;
  l496:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "rand")) goto l497;

  {  int yypos498= G->pos, yythunkpos498= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9")) goto l498;
  goto l497;
  l498:;	  G->pos= yypos498; G->thunkpos= yythunkpos498;
  }  yyDo(G, yy_15_term, G->begin, G->end, "yy_15_term");
  goto l451;
  l497:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "now")) goto l499;

  {  int yypos500= G->pos, yythunkpos500= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9")) goto l500;
  goto l499;
  l500:;	  G->pos= yypos500; G->thunkpos= yythunkpos500;
  }  yyDo(G, yy_16_term, G->begin, G->end, "yy_16_term");
  goto l451;
  l499:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "time")) goto l501;

  {  int yypos502= G->pos, yythunkpos502= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9")) goto l502;
  goto l501;
  l502:;	  G->pos= yypos502; G->thunkpos= yythunkpos502;
  }  yyDo(G, yy_17_term, G->begin, G->end, "yy_17_term");
  goto l451;
  l501:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  yyDo(G, yy_18_term, G->begin, G->end, "yy_18_term");
  if (!yymatchString(G, "$(")) goto l503;
  if (!yy__(G))  goto l503;

  {  int yypos504= G->pos, yythunkpos504= G->thunkpos;  if (!yy_expr(G))  goto l504;
  yyDo(G, yySet, -3, 0, "yySet");
  if (!yy__(G))  goto l504;
  goto l505;
  l504:;	  G->pos= yypos504; G->thunkpos= yythunkpos504;
  }
  l505:;	  if (!yymatchChar(G, ')')) goto l503;
  yyDo(G, yy_19_term, G->begin, G->end, "yy_19_term");
  goto l451;
  l503:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  yyDo(G, yy_20_term, G->begin, G->end, "yy_20_term");
  if (!yymatchString(G, "@(")) goto l506;
  if (!yy__(G))  goto l506;

  {  int yypos507= G->pos, yythunkpos507= G->thunkpos;  if (!yy_expr(G))  goto l507;
  yyDo(G, yySet, -3, 0, "yySet");
  if (!yy__(G))  goto l507;
  goto l508;
  l507:;	  G->pos= yypos507; G->thunkpos= yythunkpos507;
  }
  l508:;	  if (!yymatchChar(G, ')')) goto l506;
  yyDo(G, yy_21_term, G->begin, G->end, "yy_21_term");
  goto l451;
  l506:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  yyDo(G, yy_22_term, G->begin, G->end, "yy_22_term");
  if (!yymatchString(G, "%(")) goto l450;
  if (!yy__(G))  goto l450;

  {  int yypos509= G->pos, yythunkpos509= G->thunkpos;  if (!yy_expr(G))  goto l509;
  yyDo(G, yySet, -3, 0, "yySet");
  if (!yy__(G))  goto l509;
  goto l510;
  l509:;	  G->pos= yypos509; G->thunkpos= yythunkpos509;
  }
  l510:;	  if (!yymatchChar(G, ')')) goto l450;
  yyDo(G, yy_23_term, G->begin, G->end, "yy_23_term");

  }
  l451:;	  yyprintf((stderr, "  ok   term"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 3, 0, "yyPop");
  return 1;
  l450:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "term"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}